

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O1

void __thiscall moira::Moira::processException<(moira::Core)0>(Moira *this,exception *exc)

{
  long lVar1;
  long *plVar2;
  
  lVar1 = __dynamic_cast(exc,&std::exception::typeinfo,&AddressError::typeinfo,0);
  if ((lVar1 != 0) &&
     (execAddressError<(moira::Core)0>(this,*(StackFrame *)(lVar1 + 8),0), lVar1 != 0)) {
    return;
  }
  lVar1 = __dynamic_cast(exc,&std::exception::typeinfo,&BusError::typeinfo,0);
  if ((lVar1 != 0) && (execBusError<(moira::Core)0>(this,*(StackFrame *)(lVar1 + 8),0), lVar1 != 0))
  {
    return;
  }
  lVar1 = __dynamic_cast(exc,&std::exception::typeinfo,&DoubleFault::typeinfo,0);
  plVar2 = (long *)__cxa_allocate_exception(8);
  if (lVar1 != 0) {
    *plVar2 = lVar1;
    __cxa_throw(plVar2,&DoubleFault_const*::typeinfo,0);
  }
  *plVar2 = (long)&__cxxabiv1::__pointer_type_info::vtable;
  __cxa_throw(plVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void
Moira::processException(const std::exception &exc)
{
    try {

        if (auto ae = dynamic_cast<const AddressError *>(&exc); ae) {

            execAddressError<C>(ae->stackFrame);
            return;
        }

        if (auto be = dynamic_cast<const BusError *>(&exc); be) {

            execBusError<C>(be->stackFrame);
            return;
        }

        if (auto df = dynamic_cast<const DoubleFault *>(&exc); df) {

            throw df;
        }

    } catch (DoubleFault &df) {

        halt();
        return;
    }

    throw exc;
}